

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bssplitstrcb(bStream *s,const_bstring splitStr,_func_int_void_ptr_int_const_bstring *cb,
                void *parm)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bstring r;
  int iVar4;
  tagbstring t;
  tagbstring local_40;
  
  uVar3 = 0xffffffff;
  if ((((s != (bStream *)0x0 && cb != (_func_int_void_ptr_int_const_bstring *)0x0) &&
       (splitStr != (const_bstring)0x0)) && (s->readFnPtr != (bNread)0x0)) && (-1 < splitStr->slen))
  {
    if (splitStr->slen == 1) {
      iVar1 = bssplitscb(s,splitStr,cb,parm);
      return iVar1;
    }
    r = bfromcstr(anon_var_dwarf_3510d + 0x10);
    if (r != (bstring)0x0) {
      if (splitStr->slen == 0) {
        while (iVar1 = bsreada(r,s,0x100), -1 < iVar1) {
          uVar3 = (*cb)(parm,0,r);
          if ((int)uVar3 < 0) goto LAB_001513cd;
          r->slen = 0;
        }
        bdestroy(r);
        uVar3 = 0;
      }
      else {
        iVar1 = 0;
        do {
          while (iVar2 = binstr(r,0,splitStr), -1 < iVar2) {
            local_40.data = r->data;
            local_40.mlen = -1;
            iVar4 = splitStr->slen;
            local_40.slen = iVar2;
            uVar3 = (*cb)(parm,iVar1,&local_40);
            if ((int)uVar3 < 0) goto LAB_001513cd;
            iVar4 = iVar4 + iVar2;
            iVar1 = iVar1 + iVar4;
            bdelete(r,0,iVar4);
          }
          bsreada(r,s,0x100);
        } while ((s->readFnPtr != (bNread)0x0) && ((s->isEOF == 0 || (s->buff->slen != 0))));
        uVar3 = (*cb)(parm,iVar1,r);
        uVar3 = (int)uVar3 >> 0x1f & uVar3;
LAB_001513cd:
        bdestroy(r);
      }
    }
  }
  return uVar3;
}

Assistant:

int bssplitstrcb (struct bStream * s, const_bstring splitStr,
	int (* cb) (void * parm, int ofs, const_bstring entry), void * parm) {
	bstring buff;
	int i = 0, p = 0, ret = 0;

	if (cb == NULL || s == NULL || s->readFnPtr == NULL
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (splitStr->slen == 1) return bssplitscb (s, splitStr, cb, parm);

	if (NULL == (buff = bfromcstr (""))) return BSTR_ERR;

	if (splitStr->slen == 0) {
		for (i=0; bsreada (buff, s, BSSSC_BUFF_LEN) >= 0; i++) {
			if ((ret = cb (parm, 0, buff)) < 0) {
				bdestroy (buff);
				return ret;
			}
			buff->slen = 0;
		}
		bdestroy (buff);
		return BSTR_OK;
	} else {
		for (;;) {
			if ((ret = binstr (buff, 0, splitStr)) >= 0) {
				struct tagbstring t;
				blk2tbstr (t, buff->data, ret);
				i = ret + splitStr->slen;
				if ((ret = cb (parm, p, &t)) < 0) break;
				p += i;
				bdelete (buff, 0, i);
			} else {
				bsreada (buff, s, BSSSC_BUFF_LEN);
				if (bseof (s)) {
					if ((ret = cb (parm, p, buff)) > 0) ret = 0;
					break;
				}
			}
		}
	}

	bdestroy (buff);
	return ret;
}